

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

type __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::
operator()(arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>
           *this,longdouble value)

{
  undefined8 *puVar1;
  format_specs local_28;
  
  puVar1 = *(undefined8 **)(this + 0x10);
  if (puVar1 == (undefined8 *)0x0) {
    local_28.super_align_spec.width_ = 0;
    local_28.super_align_spec.fill_ = L' ';
    local_28.super_align_spec.align_ = ALIGN_DEFAULT;
    local_28.super_core_format_specs.precision = -1;
    local_28.super_core_format_specs.flags = '\0';
    local_28.super_core_format_specs.type = '\0';
  }
  else {
    local_28.super_core_format_specs._4_2_ = *(undefined2 *)(puVar1 + 2);
    local_28.super_align_spec._0_8_ = *puVar1;
    local_28._8_8_ = puVar1[1];
  }
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
  ::write_double<long_double>
            ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
              *)this,value,&local_28);
  return (type)*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this;
}

Assistant:

typename std::enable_if<std::is_floating_point<T>::value, iterator>::type
      operator()(T value) {
    writer_.write_double(value, specs_ ? *specs_ : format_specs());
    return out();
  }